

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3sDrawTests.cpp
# Opt level: O0

int __thiscall
deqp::gles3::Stress::anon_unknown_0::RandomGroup::init(RandomGroup *this,EVP_PKEY_CTX *ctx)

{
  TestContext *testCtx;
  Storage SVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  CompatibilityTestType CVar5;
  int extraout_EAX;
  reference pvVar6;
  DrawTest *this_00;
  RenderContext *renderCtx;
  char *name;
  char *desc;
  string local_418;
  string local_3f8;
  _Self local_3d8;
  _Self local_3d0;
  int local_3c4;
  uint local_3c0;
  int attrNdx_1;
  deUint32 hash;
  OutputType local_3b4;
  AttributeSpec attribSpec;
  bool valid;
  int attrNdx;
  undefined1 local_380 [8];
  DrawTestSpec spec;
  int attributeCount;
  undefined1 local_31c [8];
  Random random;
  int ndx;
  size_t insertedCount;
  set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> insertedHashes;
  UniformWeightArray<9> usageWeights;
  Usage usages [9];
  undefined1 local_278 [8];
  UniformWeightArray<12> outputTypeWeights;
  OutputType outputTypes [12];
  UniformWeightArray<11> inputTypeWeights;
  InputType inputTypes [11];
  UniformWeightArray<2> local_1b4;
  UniformWeightArray<2> storageWeights;
  Storage storages [2];
  UniformWeightArray<3> indexTypeWeights;
  IndexType indexTypes [3];
  UniformWeightArray<5> drawMethodWeights;
  DrawMethod drawMethods [5];
  UniformWeightArray<7> primitiveWeights;
  Primitive primitives [7];
  float instanceDivisorWeights [4];
  int instanceDivisors [4];
  float strideWeights [4];
  int strides [4];
  float offsetWeights [4];
  int offsets [4];
  float indexWeights [4];
  int indexMaxs [4];
  int indexMins [4];
  float instanceWeights [4];
  int instanceCounts [4];
  float firstWeights [3];
  int firsts [3];
  float indexOffsetWeights [3];
  int indexOffsets [3];
  float primitiveCountWeights [3];
  int primitiveCounts [3];
  float attribWeights [3];
  int attribCounts [3];
  int numAttempts;
  RandomGroup *this_local;
  
  attribCounts[1] = 300;
  attribWeights[1] = 1.4013e-45;
  attribWeights[2] = 2.8026e-45;
  attribCounts[0] = 5;
  primitiveCounts[1] = 0x41f00000;
  primitiveCounts[2] = 0x41200000;
  attribWeights[0] = 1.0;
  primitiveCountWeights[1] = 1.4013e-45;
  primitiveCountWeights[2] = 7.00649e-45;
  primitiveCounts[0] = 0x40;
  indexOffsets[1] = 0x41a00000;
  indexOffsets[2] = 0x41200000;
  primitiveCountWeights[0] = 1.0;
  indexOffsetWeights[1] = 0.0;
  indexOffsetWeights[2] = 9.80909e-45;
  indexOffsets[0] = 0xd;
  firsts[1] = 0x41a00000;
  firsts[2] = 0x41a00000;
  indexOffsetWeights[0] = 1.0;
  firstWeights[1] = 0.0;
  firstWeights[2] = 9.80909e-45;
  firsts[0] = 0xd;
  stack0xffffffffffffff8c = 0x41a0000041a00000;
  firstWeights[0] = 1.0;
  instanceWeights[2] = 1.4013e-45;
  instanceWeights[3] = 2.8026e-45;
  instanceCounts[0] = 0x10;
  instanceCounts[1] = 0x11;
  indexMins[2] = 0x41a00000;
  indexMins[3] = 0x41200000;
  instanceWeights[0] = 5.0;
  instanceWeights[1] = 1.0;
  indexMaxs[2] = 0;
  indexMaxs[3] = 1;
  indexMins[0] = 3;
  indexMins[1] = 8;
  indexWeights[2] = 5.60519e-45;
  indexWeights[3] = 1.12104e-44;
  indexMaxs[0] = 0x80;
  indexMaxs[1] = 0x101;
  offsets[2] = 0x42480000;
  offsets[3] = 0x42480000;
  indexWeights[0] = 50.0;
  indexWeights[1] = 50.0;
  offsetWeights[2] = 0.0;
  offsetWeights[3] = 1.4013e-45;
  offsets[0] = 5;
  offsets[1] = 0xc;
  strides[2] = 0x42480000;
  strides[3] = 0x41200000;
  offsetWeights[0] = 10.0;
  offsetWeights[1] = 10.0;
  strideWeights[2] = 0.0;
  strideWeights[3] = 9.80909e-45;
  strides[0] = 0x10;
  strides[1] = 0x11;
  instanceDivisors[2] = 0x42480000;
  instanceDivisors[3] = 0x41200000;
  strideWeights[0] = 10.0;
  strideWeights[1] = 10.0;
  instanceDivisorWeights[2] = 0.0;
  instanceDivisorWeights[3] = 1.4013e-45;
  instanceDivisors[0] = 3;
  instanceDivisors[1] = 0x81;
  stack0xfffffffffffffed8 = 0x41f00000428c0000;
  instanceDivisorWeights[0] = 10.0;
  instanceDivisorWeights[1] = 10.0;
  primitiveWeights.weights[5] = 0.0;
  primitiveWeights.weights[6] = 1.4013e-45;
  primitives[0] = PRIMITIVE_TRIANGLE_FAN;
  primitives[1] = PRIMITIVE_TRIANGLE_STRIP;
  primitives[2] = PRIMITIVE_LINES;
  primitives[3] = PRIMITIVE_LINE_STRIP;
  primitives[4] = PRIMITIVE_LINE_LOOP;
  unique0x10000e95 = this;
  UniformWeightArray<7>::UniformWeightArray((UniformWeightArray<7> *)(drawMethods + 3));
  drawMethodWeights.weights[3] = 0.0;
  drawMethodWeights.weights[4] = 1.4013e-45;
  drawMethods[0] = DRAWMETHOD_DRAWELEMENTS;
  drawMethods[1] = DRAWMETHOD_DRAWELEMENTS_RANGED;
  drawMethods[2] = DRAWMETHOD_DRAWELEMENTS_INSTANCED;
  UniformWeightArray<5>::UniformWeightArray((UniformWeightArray<5> *)(indexTypes + 1));
  indexTypeWeights.weights[1] = 0.0;
  indexTypeWeights.weights[2] = 1.4013e-45;
  indexTypes[0] = INDEXTYPE_INT;
  UniformWeightArray<3>::UniformWeightArray((UniformWeightArray<3> *)storages);
  storageWeights.weights[0] = 0.0;
  storageWeights.weights[1] = 1.4013e-45;
  UniformWeightArray<2>::UniformWeightArray(&local_1b4);
  memcpy(inputTypeWeights.weights + 9,&DAT_012ccd50,0x2c);
  UniformWeightArray<11>::UniformWeightArray((UniformWeightArray<11> *)(outputTypes + 0xb));
  memcpy(outputTypeWeights.weights + 10,&DAT_012ccd80,0x30);
  UniformWeightArray<12>::UniformWeightArray((UniformWeightArray<12> *)local_278);
  memcpy(usageWeights.weights + 7,&DAT_012ccdb0,0x24);
  UniformWeightArray<9>::UniformWeightArray
            ((UniformWeightArray<9> *)
             ((long)&insertedHashes._M_t._M_impl.super__Rb_tree_header._M_node_count + 4));
  std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::set
            ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)
             &insertedCount);
  stack0xfffffffffffffcf8 = 0;
  for (random.m_rnd.z = 0; (int)random.m_rnd.z < 300; random.m_rnd.z = random.m_rnd.z + 1) {
    de::Random::Random((Random *)local_31c,random.m_rnd.z + 0xc551393);
    spec.attribs.
    super__Vector_base<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ =
         de::Random::chooseWeighted<int,int_const*,float_const*>
                   ((Random *)local_31c,(int *)(attribWeights + 1),attribCounts + 1,
                    (float *)(primitiveCounts + 1));
    deqp::gls::DrawTestSpec::DrawTestSpec((DrawTestSpec *)local_380);
    local_380._0_4_ = glu::ApiType::es(3,0);
    local_380._4_4_ =
         de::Random::
         chooseWeighted<deqp::gls::DrawTestSpec::Primitive,deqp::gls::DrawTestSpec::Primitive*,float_const*>
                   ((Random *)local_31c,(Primitive *)(primitiveWeights.weights + 5),primitives + 5,
                    (float *)(drawMethods + 3));
    spec.apiType.m_bits =
         de::Random::chooseWeighted<int,int_const*,float_const*>
                   ((Random *)local_31c,(int *)(primitiveCountWeights + 1),primitiveCounts + 1,
                    (float *)(indexOffsets + 1));
    spec.primitive =
         de::Random::
         chooseWeighted<deqp::gls::DrawTestSpec::DrawMethod,deqp::gls::DrawTestSpec::DrawMethod*,float_const*>
                   ((Random *)local_31c,(DrawMethod *)(drawMethodWeights.weights + 3),
                    drawMethods + 3,(float *)(indexTypes + 1));
    spec.primitiveCount =
         de::Random::
         chooseWeighted<deqp::gls::DrawTestSpec::IndexType,deqp::gls::DrawTestSpec::IndexType*,float_const*>
                   ((Random *)local_31c,(IndexType *)(indexTypeWeights.weights + 1),indexTypes + 1,
                    (float *)storages);
    spec.drawMethod =
         de::Random::chooseWeighted<int,int_const*,float_const*>
                   ((Random *)local_31c,(int *)(indexOffsetWeights + 1),indexOffsets + 1,
                    (float *)(firsts + 1));
    spec.indexType =
         de::Random::
         chooseWeighted<deqp::gls::DrawTestSpec::Storage,deqp::gls::DrawTestSpec::Storage*,float_const*>
                   ((Random *)local_31c,(Storage *)&storageWeights,storages,local_1b4.weights);
    spec.indexPointerOffset =
         de::Random::chooseWeighted<int,int_const*,float_const*>
                   ((Random *)local_31c,(int *)(firstWeights + 1),firsts + 1,
                    (float *)(instanceCounts + 3));
    spec.indexStorage =
         de::Random::chooseWeighted<int,int_const*,float_const*>
                   ((Random *)local_31c,indexMaxs + 2,indexMins + 2,(float *)(offsets + 2));
    spec.first = de::Random::chooseWeighted<int,int_const*,float_const*>
                           ((Random *)local_31c,(int *)(indexWeights + 2),indexMaxs + 2,
                            (float *)(offsets + 2));
    spec.indexMin =
         de::Random::chooseWeighted<int,int_const*,float_const*>
                   ((Random *)local_31c,(int *)(instanceWeights + 2),instanceCounts + 2,
                    (float *)(indexMins + 2));
    bVar2 = deqp::gls::DrawTestSpec::valid((DrawTestSpec *)local_380);
    if (bVar2) {
      attribSpec.useDefaultAttribute = false;
      attribSpec.additionalPositionAttribute = false;
      attribSpec.bgraComponentOrder = false;
      attribSpec._39_1_ = 0;
      while ((int)attribSpec._36_4_ <
             (int)spec.attribs.
                  super__Vector_base<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        deqp::gls::DrawTestSpec::AttributeSpec::AttributeSpec((AttributeSpec *)&hash);
        hash = de::Random::
               chooseWeighted<deqp::gls::DrawTestSpec::InputType,deqp::gls::DrawTestSpec::InputType*,float_const*>
                         ((Random *)local_31c,(InputType *)(inputTypeWeights.weights + 9),
                          inputTypes + 9,(float *)(outputTypes + 0xb));
        local_3b4 = de::Random::
                    chooseWeighted<deqp::gls::DrawTestSpec::OutputType,deqp::gls::DrawTestSpec::OutputType*,float_const*>
                              ((Random *)local_31c,(OutputType *)(outputTypeWeights.weights + 10),
                               outputTypes + 10,(float *)local_278);
        attribSpec.inputType =
             de::Random::
             chooseWeighted<deqp::gls::DrawTestSpec::Storage,deqp::gls::DrawTestSpec::Storage*,float_const*>
                       ((Random *)local_31c,(Storage *)&storageWeights,storages,local_1b4.weights);
        attribSpec.outputType =
             de::Random::
             chooseWeighted<deqp::gls::DrawTestSpec::Usage,deqp::gls::DrawTestSpec::Usage*,float_const*>
                       ((Random *)local_31c,(Usage *)(usageWeights.weights + 7),usages + 7,
                        (float *)((long)&insertedHashes._M_t._M_impl.super__Rb_tree_header.
                                         _M_node_count + 4));
        attribSpec.storage = de::Random::getInt((Random *)local_31c,1,4);
        attribSpec.usage =
             de::Random::chooseWeighted<int,int_const*,float_const*>
                       ((Random *)local_31c,(int *)(offsetWeights + 2),offsets + 2,
                        (float *)(strides + 2));
        attribSpec.componentCount =
             de::Random::chooseWeighted<int,int_const*,float_const*>
                       ((Random *)local_31c,(int *)(strideWeights + 2),strides + 2,
                        (float *)(instanceDivisors + 2));
        attribSpec.offset._0_1_ = de::Random::getBool((Random *)local_31c);
        attribSpec.stride =
             de::Random::chooseWeighted<int,int_const*,float_const*>
                       ((Random *)local_31c,(int *)(instanceDivisorWeights + 2),instanceDivisors + 2
                        ,(float *)(primitives + 6));
        attribSpec.normalize = de::Random::getBool((Random *)local_31c);
        attrNdx_1 = local_380._0_4_;
        attribSpec.instanceDivisor._3_1_ =
             deqp::gls::DrawTestSpec::AttributeSpec::valid
                       ((AttributeSpec *)&hash,(ApiType)local_380._0_4_);
        SVar1 = attribSpec.storage;
        if ((attribSpec.componentCount != 0) &&
           (iVar3 = deqp::gls::DrawTestSpec::inputTypeSize(hash),
           attribSpec.componentCount < (int)(SVar1 * iVar3))) {
          attribSpec.instanceDivisor._3_1_ = 0;
        }
        if ((attribSpec.instanceDivisor._3_1_ & 1) != 0) {
          std::
          vector<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
          ::push_back((vector<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
                       *)&spec.baseVertex,(value_type *)&hash);
          attribSpec._36_4_ = attribSpec._36_4_ + 1;
        }
      }
      if (local_380._4_4_ != PRIMITIVE_POINTS) {
        pvVar6 = std::
                 vector<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
                 ::operator[]((vector<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
                               *)&spec.baseVertex,0);
        pvVar6->instanceDivisor = 0;
      }
      if (((((spec.primitive != PRIMITIVE_LINES) || (spec.indexStorage != spec.first)) ||
           (local_380._4_4_ == PRIMITIVE_POINTS)) &&
          ((pvVar6 = std::
                     vector<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
                     ::operator[]((vector<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
                                   *)&spec.baseVertex,0), (pvVar6->useDefaultAttribute & 1U) == 0 ||
           (local_380._4_4_ == PRIMITIVE_POINTS)))) &&
         (((local_380._4_4_ != PRIMITIVE_TRIANGLES &&
           ((local_380._4_4_ != PRIMITIVE_TRIANGLE_FAN &&
            (local_380._4_4_ != PRIMITIVE_TRIANGLE_STRIP)))) ||
          ((pvVar6 = std::
                     vector<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
                     ::operator[]((vector<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
                                   *)&spec.baseVertex,0), pvVar6->componentCount != 1 &&
           ((((pvVar6 = std::
                        vector<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
                        ::operator[]((vector<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
                                      *)&spec.baseVertex,0), pvVar6->outputType != OUTPUTTYPE_FLOAT
              && (pvVar6 = std::
                           vector<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
                           ::operator[]((vector<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
                                         *)&spec.baseVertex,0), pvVar6->outputType != OUTPUTTYPE_INT
                 )) && (pvVar6 = std::
                                 vector<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
                                 ::operator[]((vector<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
                                               *)&spec.baseVertex,0),
                       pvVar6->outputType != OUTPUTTYPE_UINT)) &&
            ((spec.primitive != PRIMITIVE_LINES || (1 < (int)(spec.first - spec.indexStorage))))))))
          ))) {
        local_3c0 = deqp::gls::DrawTestSpec::hash((DrawTestSpec *)local_380);
        for (local_3c4 = 0;
            local_3c4 <
            (int)spec.attribs.
                 super__Vector_base<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage; local_3c4 = local_3c4 + 1) {
          uVar4 = local_3c0 << 2;
          pvVar6 = std::
                   vector<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
                   ::operator[]((vector<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
                                 *)&spec.baseVertex,(long)local_3c4);
          local_3c0 = deqp::gls::DrawTestSpec::AttributeSpec::hash(pvVar6);
          local_3c0 = uVar4 ^ local_3c0;
        }
        local_3d0._M_node =
             (_Base_ptr)
             std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::find
                       ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *
                        )&insertedCount,&local_3c0);
        local_3d8._M_node =
             (_Base_ptr)
             std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::end
                       ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *
                        )&insertedCount);
        bVar2 = std::operator==(&local_3d0,&local_3d8);
        if (bVar2) {
          CVar5 = deqp::gls::DrawTestSpec::isCompatibilityTest((DrawTestSpec *)local_380);
          if ((CVar5 == COMPATIBILITY_UNALIGNED_OFFSET) ||
             (CVar5 = deqp::gls::DrawTestSpec::isCompatibilityTest((DrawTestSpec *)local_380),
             CVar5 == COMPATIBILITY_UNALIGNED_STRIDE)) {
            this_00 = (DrawTest *)operator_new(0x138);
            testCtx = (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx;
            renderCtx = Context::getRenderContext((this->super_TestCaseGroup).m_context);
            de::toString<unsigned_long>(&local_3f8,(unsigned_long *)&random.m_rnd.w);
            name = (char *)std::__cxx11::string::c_str();
            deqp::gls::DrawTestSpec::getDesc_abi_cxx11_(&local_418,(DrawTestSpec *)local_380);
            desc = (char *)std::__cxx11::string::c_str();
            deqp::gls::DrawTest::DrawTest
                      (this_00,testCtx,renderCtx,(DrawTestSpec *)local_380,name,desc);
            tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_00);
            std::__cxx11::string::~string((string *)&local_418);
            std::__cxx11::string::~string((string *)&local_3f8);
          }
          std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::insert
                    ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)
                     &insertedCount,&local_3c0);
          register0x00000000 = stack0xfffffffffffffcf8 + 1;
        }
      }
    }
    deqp::gls::DrawTestSpec::~DrawTestSpec((DrawTestSpec *)local_380);
    de::Random::~Random((Random *)local_31c);
  }
  std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::~set
            ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)
             &insertedCount);
  return extraout_EAX;
}

Assistant:

void RandomGroup::init (void)
{
	const int	numAttempts				= 300;

	const int	attribCounts[]			= { 1, 2, 5 };
	const float	attribWeights[]			= { 30, 10, 1 };
	const int	primitiveCounts[]		= { 1, 5, 64 };
	const float	primitiveCountWeights[]	= { 20, 10, 1 };
	const int	indexOffsets[]			= { 0, 7, 13 };
	const float	indexOffsetWeights[]	= { 20, 20, 1 };
	const int	firsts[]				= { 0, 7, 13 };
	const float	firstWeights[]			= { 20, 20, 1 };
	const int	instanceCounts[]		= { 1, 2, 16, 17 };
	const float	instanceWeights[]		= { 20, 10, 5, 1 };
	const int	indexMins[]				= { 0, 1, 3, 8 };
	const int	indexMaxs[]				= { 4, 8, 128, 257 };
	const float	indexWeights[]			= { 50, 50, 50, 50 };
	const int	offsets[]				= { 0, 1, 5, 12 };
	const float	offsetWeights[]			= { 50, 10, 10, 10 };
	const int	strides[]				= { 0, 7, 16, 17 };
	const float	strideWeights[]			= { 50, 10, 10, 10 };
	const int	instanceDivisors[]		= { 0, 1, 3, 129 };
	const float	instanceDivisorWeights[]= { 70, 30, 10, 10 };

	gls::DrawTestSpec::Primitive primitives[] =
	{
		gls::DrawTestSpec::PRIMITIVE_POINTS,
		gls::DrawTestSpec::PRIMITIVE_TRIANGLES,
		gls::DrawTestSpec::PRIMITIVE_TRIANGLE_FAN,
		gls::DrawTestSpec::PRIMITIVE_TRIANGLE_STRIP,
		gls::DrawTestSpec::PRIMITIVE_LINES,
		gls::DrawTestSpec::PRIMITIVE_LINE_STRIP,
		gls::DrawTestSpec::PRIMITIVE_LINE_LOOP
	};
	const UniformWeightArray<DE_LENGTH_OF_ARRAY(primitives)> primitiveWeights;

	gls::DrawTestSpec::DrawMethod drawMethods[] =
	{
		gls::DrawTestSpec::DRAWMETHOD_DRAWARRAYS,
		gls::DrawTestSpec::DRAWMETHOD_DRAWARRAYS_INSTANCED,
		gls::DrawTestSpec::DRAWMETHOD_DRAWELEMENTS,
		gls::DrawTestSpec::DRAWMETHOD_DRAWELEMENTS_RANGED,
		gls::DrawTestSpec::DRAWMETHOD_DRAWELEMENTS_INSTANCED
	};
	const UniformWeightArray<DE_LENGTH_OF_ARRAY(drawMethods)> drawMethodWeights;

	gls::DrawTestSpec::IndexType indexTypes[] =
	{
		gls::DrawTestSpec::INDEXTYPE_BYTE,
		gls::DrawTestSpec::INDEXTYPE_SHORT,
		gls::DrawTestSpec::INDEXTYPE_INT,
	};
	const UniformWeightArray<DE_LENGTH_OF_ARRAY(indexTypes)> indexTypeWeights;

	gls::DrawTestSpec::Storage storages[] =
	{
		gls::DrawTestSpec::STORAGE_USER,
		gls::DrawTestSpec::STORAGE_BUFFER,
	};
	const UniformWeightArray<DE_LENGTH_OF_ARRAY(storages)> storageWeights;

	gls::DrawTestSpec::InputType inputTypes[] =
	{
		gls::DrawTestSpec::INPUTTYPE_FLOAT,
		gls::DrawTestSpec::INPUTTYPE_FIXED,
		gls::DrawTestSpec::INPUTTYPE_BYTE,
		gls::DrawTestSpec::INPUTTYPE_SHORT,
		gls::DrawTestSpec::INPUTTYPE_UNSIGNED_BYTE,
		gls::DrawTestSpec::INPUTTYPE_UNSIGNED_SHORT,
		gls::DrawTestSpec::INPUTTYPE_INT,
		gls::DrawTestSpec::INPUTTYPE_UNSIGNED_INT,
		gls::DrawTestSpec::INPUTTYPE_HALF,
		gls::DrawTestSpec::INPUTTYPE_UNSIGNED_INT_2_10_10_10,
		gls::DrawTestSpec::INPUTTYPE_INT_2_10_10_10,
	};
	const UniformWeightArray<DE_LENGTH_OF_ARRAY(inputTypes)> inputTypeWeights;

	gls::DrawTestSpec::OutputType outputTypes[] =
	{
		gls::DrawTestSpec::OUTPUTTYPE_FLOAT,
		gls::DrawTestSpec::OUTPUTTYPE_VEC2,
		gls::DrawTestSpec::OUTPUTTYPE_VEC3,
		gls::DrawTestSpec::OUTPUTTYPE_VEC4,
		gls::DrawTestSpec::OUTPUTTYPE_INT,
		gls::DrawTestSpec::OUTPUTTYPE_UINT,
		gls::DrawTestSpec::OUTPUTTYPE_IVEC2,
		gls::DrawTestSpec::OUTPUTTYPE_IVEC3,
		gls::DrawTestSpec::OUTPUTTYPE_IVEC4,
		gls::DrawTestSpec::OUTPUTTYPE_UVEC2,
		gls::DrawTestSpec::OUTPUTTYPE_UVEC3,
		gls::DrawTestSpec::OUTPUTTYPE_UVEC4,
	};
	const UniformWeightArray<DE_LENGTH_OF_ARRAY(outputTypes)> outputTypeWeights;

	gls::DrawTestSpec::Usage usages[] =
	{
		gls::DrawTestSpec::USAGE_DYNAMIC_DRAW,
		gls::DrawTestSpec::USAGE_STATIC_DRAW,
		gls::DrawTestSpec::USAGE_STREAM_DRAW,
		gls::DrawTestSpec::USAGE_STREAM_READ,
		gls::DrawTestSpec::USAGE_STREAM_COPY,
		gls::DrawTestSpec::USAGE_STATIC_READ,
		gls::DrawTestSpec::USAGE_STATIC_COPY,
		gls::DrawTestSpec::USAGE_DYNAMIC_READ,
		gls::DrawTestSpec::USAGE_DYNAMIC_COPY,
	};
	const UniformWeightArray<DE_LENGTH_OF_ARRAY(usages)> usageWeights;

	std::set<deUint32>	insertedHashes;
	size_t				insertedCount = 0;

	for (int ndx = 0; ndx < numAttempts; ++ndx)
	{
		de::Random random(0xc551393 + ndx); // random does not depend on previous cases

		int					attributeCount = random.chooseWeighted<int, const int*, const float*>(DE_ARRAY_BEGIN(attribCounts), DE_ARRAY_END(attribCounts), attribWeights);
		gls::DrawTestSpec	spec;

		spec.apiType				= glu::ApiType::es(3,0);
		spec.primitive				= random.chooseWeighted<gls::DrawTestSpec::Primitive>	(DE_ARRAY_BEGIN(primitives),		DE_ARRAY_END(primitives),		primitiveWeights.weights);
		spec.primitiveCount			= random.chooseWeighted<int, const int*, const float*>	(DE_ARRAY_BEGIN(primitiveCounts),	DE_ARRAY_END(primitiveCounts),	primitiveCountWeights);
		spec.drawMethod				= random.chooseWeighted<gls::DrawTestSpec::DrawMethod>	(DE_ARRAY_BEGIN(drawMethods),		DE_ARRAY_END(drawMethods),		drawMethodWeights.weights);
		spec.indexType				= random.chooseWeighted<gls::DrawTestSpec::IndexType>	(DE_ARRAY_BEGIN(indexTypes),		DE_ARRAY_END(indexTypes),		indexTypeWeights.weights);
		spec.indexPointerOffset		= random.chooseWeighted<int, const int*, const float*>	(DE_ARRAY_BEGIN(indexOffsets),		DE_ARRAY_END(indexOffsets),		indexOffsetWeights);
		spec.indexStorage			= random.chooseWeighted<gls::DrawTestSpec::Storage>		(DE_ARRAY_BEGIN(storages),			DE_ARRAY_END(storages),			storageWeights.weights);
		spec.first					= random.chooseWeighted<int, const int*, const float*>	(DE_ARRAY_BEGIN(firsts),			DE_ARRAY_END(firsts),			firstWeights);
		spec.indexMin				= random.chooseWeighted<int, const int*, const float*>	(DE_ARRAY_BEGIN(indexMins),			DE_ARRAY_END(indexMins),		indexWeights);
		spec.indexMax				= random.chooseWeighted<int, const int*, const float*>	(DE_ARRAY_BEGIN(indexMaxs),			DE_ARRAY_END(indexMaxs),		indexWeights);
		spec.instanceCount			= random.chooseWeighted<int, const int*, const float*>	(DE_ARRAY_BEGIN(instanceCounts),	DE_ARRAY_END(instanceCounts),	instanceWeights);

		// check spec is legal
		if (!spec.valid())
			continue;

		for (int attrNdx = 0; attrNdx < attributeCount;)
		{
			bool valid;
			gls::DrawTestSpec::AttributeSpec attribSpec;

			attribSpec.inputType			= random.chooseWeighted<gls::DrawTestSpec::InputType>	(DE_ARRAY_BEGIN(inputTypes),		DE_ARRAY_END(inputTypes),		inputTypeWeights.weights);
			attribSpec.outputType			= random.chooseWeighted<gls::DrawTestSpec::OutputType>	(DE_ARRAY_BEGIN(outputTypes),		DE_ARRAY_END(outputTypes),		outputTypeWeights.weights);
			attribSpec.storage				= random.chooseWeighted<gls::DrawTestSpec::Storage>		(DE_ARRAY_BEGIN(storages),			DE_ARRAY_END(storages),			storageWeights.weights);
			attribSpec.usage				= random.chooseWeighted<gls::DrawTestSpec::Usage>		(DE_ARRAY_BEGIN(usages),			DE_ARRAY_END(usages),			usageWeights.weights);
			attribSpec.componentCount		= random.getInt(1, 4);
			attribSpec.offset				= random.chooseWeighted<int, const int*, const float*>(DE_ARRAY_BEGIN(offsets), DE_ARRAY_END(offsets), offsetWeights);
			attribSpec.stride				= random.chooseWeighted<int, const int*, const float*>(DE_ARRAY_BEGIN(strides), DE_ARRAY_END(strides), strideWeights);
			attribSpec.normalize			= random.getBool();
			attribSpec.instanceDivisor		= random.chooseWeighted<int, const int*, const float*>(DE_ARRAY_BEGIN(instanceDivisors), DE_ARRAY_END(instanceDivisors), instanceDivisorWeights);
			attribSpec.useDefaultAttribute	= random.getBool();

			// check spec is legal
			valid = attribSpec.valid(spec.apiType);

			// we do not want interleaved elements. (Might result in some weird floating point values)
			if (attribSpec.stride && attribSpec.componentCount * gls::DrawTestSpec::inputTypeSize(attribSpec.inputType) > attribSpec.stride)
				valid = false;

			// try again if not valid
			if (valid)
			{
				spec.attribs.push_back(attribSpec);
				++attrNdx;
			}
		}

		// Do not collapse all vertex positions to a single positions
		if (spec.primitive != gls::DrawTestSpec::PRIMITIVE_POINTS)
			spec.attribs[0].instanceDivisor = 0;

		// Is render result meaningful?
		{
			// Only one vertex
			if (spec.drawMethod == gls::DrawTestSpec::DRAWMETHOD_DRAWELEMENTS_RANGED && spec.indexMin == spec.indexMax && spec.primitive != gls::DrawTestSpec::PRIMITIVE_POINTS)
				continue;
			if (spec.attribs[0].useDefaultAttribute && spec.primitive != gls::DrawTestSpec::PRIMITIVE_POINTS)
				continue;

			// Triangle only on one axis
			if (spec.primitive == gls::DrawTestSpec::PRIMITIVE_TRIANGLES || spec.primitive == gls::DrawTestSpec::PRIMITIVE_TRIANGLE_FAN || spec.primitive == gls::DrawTestSpec::PRIMITIVE_TRIANGLE_STRIP)
			{
				if (spec.attribs[0].componentCount == 1)
					continue;
				if (spec.attribs[0].outputType == gls::DrawTestSpec::OUTPUTTYPE_FLOAT || spec.attribs[0].outputType == gls::DrawTestSpec::OUTPUTTYPE_INT || spec.attribs[0].outputType == gls::DrawTestSpec::OUTPUTTYPE_UINT)
					continue;
				if (spec.drawMethod == gls::DrawTestSpec::DRAWMETHOD_DRAWELEMENTS_RANGED && (spec.indexMax - spec.indexMin) < 2)
					continue;
			}
		}

		// Add case
		{
			deUint32 hash = spec.hash();
			for (int attrNdx = 0; attrNdx < attributeCount; ++attrNdx)
				hash = (hash << 2) ^ (deUint32)spec.attribs[attrNdx].hash();

			if (insertedHashes.find(hash) == insertedHashes.end())
			{
				// Only unaligned cases
				if (spec.isCompatibilityTest() == gls::DrawTestSpec::COMPATIBILITY_UNALIGNED_OFFSET ||
					spec.isCompatibilityTest() == gls::DrawTestSpec::COMPATIBILITY_UNALIGNED_STRIDE)
					this->addChild(new gls::DrawTest(m_testCtx, m_context.getRenderContext(), spec, de::toString(insertedCount).c_str(), spec.getDesc().c_str()));
				insertedHashes.insert(hash);

				++insertedCount;
			}
		}
	}
}